

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O3

Am_Constraint * __thiscall
Web_Constraint::Copy(Web_Constraint *this,Am_Slot *param_1,Am_Slot *new_slot)

{
  Am_Web_Create_Proc *pAVar1;
  Am_Web_Data *pAVar2;
  Am_Web_Data *pAVar3;
  Am_Web_Validate_Proc *pAVar4;
  Am_Web_Initialize_Proc *pAVar5;
  bool bVar6;
  Am_Web_Data *pAVar7;
  
  pAVar1 = this->owner->create_proc;
  if ((pAVar1 != (Am_Web_Create_Proc *)0x0) && (bVar6 = (*pAVar1)(new_slot), bVar6)) {
    pAVar2 = this->owner;
    pAVar3 = pAVar2->prototype;
    pAVar7 = (Am_Web_Data *)operator_new(0x70);
    if (pAVar3 != (Am_Web_Data *)0x0) {
      (pAVar7->interface).super_Am_Constraint.super_Am_Registered_Type._vptr_Am_Registered_Type =
           (_func_int **)&PTR_ID_002e2860;
      (pAVar7->interface).owner = pAVar7;
      pAVar5 = pAVar3->initialize_proc;
      pAVar7->create_proc = pAVar3->create_proc;
      pAVar7->initialize_proc = pAVar5;
      pAVar7->validate_proc = pAVar3->validate_proc;
      pAVar7->prototype = pAVar3;
      pAVar7->child = (Am_Web_Data *)0x0;
      pAVar7->sibling = pAVar3->child;
      pAVar3->child = pAVar7;
      pAVar7->validating = false;
      pAVar7->initialized = false;
      pAVar7->valid = false;
      pAVar7->out_list = (Output_Port *)0x0;
      pAVar7->in_list = (Input_Port *)0x0;
      pAVar7->invalid_list = (Input_Port *)0x0;
      pAVar7->changed_first = (Input_Port *)0x0;
      pAVar7->changed_last = (Input_Port *)0x0;
      return &(pAVar7->interface).super_Am_Constraint;
    }
    pAVar4 = pAVar2->validate_proc;
    (pAVar7->interface).super_Am_Constraint.super_Am_Registered_Type._vptr_Am_Registered_Type =
         (_func_int **)&PTR_ID_002e2860;
    (pAVar7->interface).owner = pAVar7;
    pAVar5 = pAVar2->initialize_proc;
    pAVar7->create_proc = pAVar2->create_proc;
    pAVar7->initialize_proc = pAVar5;
    pAVar7->validate_proc = pAVar4;
    pAVar7->validating = false;
    pAVar7->initialized = false;
    pAVar7->valid = false;
    pAVar7->changed_first = (Input_Port *)0x0;
    pAVar7->changed_last = (Input_Port *)0x0;
    pAVar7->in_list = (Input_Port *)0x0;
    pAVar7->invalid_list = (Input_Port *)0x0;
    pAVar7->sibling = (Am_Web_Data *)0x0;
    pAVar7->out_list = (Output_Port *)0x0;
    pAVar7->prototype = (Am_Web_Data *)0x0;
    pAVar7->child = (Am_Web_Data *)0x0;
    return &(pAVar7->interface).super_Am_Constraint;
  }
  return (Am_Constraint *)0x0;
}

Assistant:

Am_Constraint *
Web_Constraint::Copy(const Am_Slot &, const Am_Slot &new_slot)
{
  if (owner->create_proc && owner->create_proc(new_slot)) {
    if (owner->prototype)
      return *(new Am_Web_Data(owner->prototype));
    else
      return *(new Am_Web_Data(owner->create_proc, owner->initialize_proc,
                               owner->validate_proc));
  }
  return nullptr;
}